

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_16x8_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  int8_t *piVar8;
  int16_t *piVar9;
  long lVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  long lVar12;
  undefined8 *puVar13;
  ulong uVar14;
  undefined8 *puVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  code *local_248 [2];
  undefined8 local_238 [2];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined1 local_218 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined1 local_1f8 [16];
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined1 local_1d8 [16];
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined8 local_138 [5];
  undefined8 auStack_110 [3];
  undefined8 uStack_f8;
  undefined8 auStack_f0 [4];
  undefined8 auStack_d0 [3];
  undefined4 auStack_b8 [34];
  undefined1 auVar18 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [12];
  undefined1 auVar41 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  
  piVar8 = av1_fwd_txfm_shift_ls[8];
  uVar14 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_248[1] = *(code **)((long)col_txfm8x8_arr + uVar14);
  local_248[0] = *(code **)((long)row_txfm8x16_arr + uVar14);
  puVar15 = local_238;
  lVar10 = 0;
  do {
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar12 = 0x80;
      piVar9 = input;
      do {
        uVar3 = *(undefined8 *)(piVar9 + 4);
        *(undefined8 *)((long)local_248 + lVar12) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)local_248 + lVar12 + 8) = uVar3;
        piVar9 = piVar9 + stride;
        lVar12 = lVar12 + -0x10;
      } while (lVar12 != 0);
    }
    else {
      lVar12 = 0;
      piVar9 = input;
      do {
        uVar3 = *(undefined8 *)(piVar9 + 4);
        *(undefined8 *)((long)local_238 + lVar12) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)local_238 + lVar12 + 8) = uVar3;
        lVar12 = lVar12 + 0x10;
        piVar9 = piVar9 + stride;
      } while (lVar12 != 0x80);
    }
    bVar2 = *piVar8;
    uVar11 = (uint)(char)bVar2;
    if ((int)uVar11 < 0) {
      auVar19 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar19 = pshuflw(auVar19,auVar19,0);
      auVar19._4_4_ = auVar19._0_4_;
      auVar19._8_4_ = auVar19._0_4_;
      auVar19._12_4_ = auVar19._0_4_;
      lVar12 = 0;
      do {
        auVar25 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar12),auVar19);
        auVar25 = psraw(auVar25,ZEXT416(-uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar25;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x80);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar19 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x80);
    }
    (*local_248[1])(puVar15,puVar15,0xd);
    bVar2 = piVar8[1];
    uVar11 = (uint)(char)bVar2;
    if ((int)uVar11 < 0) {
      auVar19 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar19 = pshuflw(auVar19,auVar19,0);
      auVar25._0_4_ = auVar19._0_4_;
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      lVar12 = 0;
      do {
        auVar19 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar12),auVar25);
        auVar19 = psraw(auVar19,ZEXT416(-uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x80);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar19 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x80);
    }
    auVar29._0_12_ = local_238._0_12_;
    auVar29._12_2_ = local_238[0]._6_2_;
    auVar29._14_2_ = uStack_222;
    auVar28._12_4_ = auVar29._12_4_;
    auVar28._0_10_ = local_238._0_10_;
    auVar28._10_2_ = uStack_224;
    auVar27._10_6_ = auVar28._10_6_;
    auVar27._0_8_ = local_238[0];
    auVar27._8_2_ = local_238[0]._4_2_;
    auVar4._4_8_ = auVar27._8_8_;
    auVar4._2_2_ = uStack_226;
    auVar4._0_2_ = local_238[0]._2_2_;
    auVar26._0_4_ = CONCAT22(local_228,(short)local_238[0]);
    auVar26._4_12_ = auVar4;
    auVar49._0_12_ = local_218._0_12_;
    auVar49._12_2_ = local_218._6_2_;
    auVar49._14_2_ = uStack_202;
    auVar48._12_4_ = auVar49._12_4_;
    auVar48._0_10_ = local_218._0_10_;
    auVar48._10_2_ = uStack_204;
    auVar47._10_6_ = auVar48._10_6_;
    auVar47._0_8_ = local_218._0_8_;
    auVar47._8_2_ = local_218._4_2_;
    auVar5._4_8_ = auVar47._8_8_;
    auVar5._2_2_ = uStack_206;
    auVar5._0_2_ = local_218._2_2_;
    auVar34._0_12_ = local_1f8._0_12_;
    auVar34._12_2_ = local_1f8._6_2_;
    auVar34._14_2_ = uStack_1e2;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_10_ = local_1f8._0_10_;
    auVar33._10_2_ = uStack_1e4;
    auVar32._10_6_ = auVar33._10_6_;
    auVar32._0_8_ = local_1f8._0_8_;
    auVar32._8_2_ = local_1f8._4_2_;
    auVar6._4_8_ = auVar32._8_8_;
    auVar6._2_2_ = uStack_1e6;
    auVar6._0_2_ = local_1f8._2_2_;
    auVar31._0_4_ = CONCAT22(local_1e8,local_1f8._0_2_);
    auVar31._4_12_ = auVar6;
    auVar57._0_12_ = local_1d8._0_12_;
    auVar57._12_2_ = local_1d8._6_2_;
    auVar57._14_2_ = uStack_1c2;
    auVar56._12_4_ = auVar57._12_4_;
    auVar56._0_10_ = local_1d8._0_10_;
    auVar56._10_2_ = uStack_1c4;
    auVar55._10_6_ = auVar56._10_6_;
    auVar55._0_8_ = local_1d8._0_8_;
    auVar55._8_2_ = local_1d8._4_2_;
    auVar7._4_8_ = auVar55._8_8_;
    auVar7._2_2_ = uStack_1c6;
    auVar7._0_2_ = local_1d8._2_2_;
    uVar17 = CONCAT22(uStack_220,(short)local_238[1]);
    auVar18._0_8_ = CONCAT26(uStack_21e,CONCAT24(local_238[1]._2_2_,uVar17));
    auVar18._8_2_ = local_238[1]._4_2_;
    auVar18._10_2_ = uStack_21c;
    auVar44._12_2_ = local_238[1]._6_2_;
    auVar44._0_12_ = auVar18;
    auVar44._14_2_ = uStack_21a;
    uVar36 = CONCAT22(uStack_200,local_218._8_2_);
    auVar37._0_8_ = CONCAT26(uStack_1fe,CONCAT24(local_218._10_2_,uVar36));
    auVar37._8_2_ = local_218._12_2_;
    auVar37._10_2_ = uStack_1fc;
    auVar38._12_2_ = local_218._14_2_;
    auVar38._0_12_ = auVar37;
    auVar38._14_2_ = uStack_1fa;
    uVar22 = CONCAT22(uStack_1e0,local_1f8._8_2_);
    auVar23._0_8_ = CONCAT26(uStack_1de,CONCAT24(local_1f8._10_2_,uVar22));
    auVar23._8_2_ = local_1f8._12_2_;
    auVar23._10_2_ = uStack_1dc;
    auVar24._12_2_ = local_1f8._14_2_;
    auVar24._0_12_ = auVar23;
    auVar24._14_2_ = uStack_1da;
    uVar51 = CONCAT22(uStack_1c0,local_1d8._8_2_);
    auVar52._0_8_ = CONCAT26(uStack_1be,CONCAT24(local_1d8._10_2_,uVar51));
    auVar52._8_2_ = local_1d8._12_2_;
    auVar52._10_2_ = uStack_1bc;
    auVar53._12_2_ = local_1d8._14_2_;
    auVar53._0_12_ = auVar52;
    auVar53._14_2_ = uStack_1ba;
    auVar45._0_8_ = auVar26._0_8_;
    auVar45._8_4_ = auVar4._0_4_;
    auVar45._12_4_ = auVar5._0_4_;
    auVar46._0_8_ = auVar31._0_8_;
    auVar46._8_4_ = auVar6._0_4_;
    auVar46._12_4_ = auVar7._0_4_;
    auVar50._8_4_ = (int)((ulong)auVar18._0_8_ >> 0x20);
    auVar50._0_8_ = auVar18._0_8_;
    auVar50._12_4_ = (int)((ulong)auVar37._0_8_ >> 0x20);
    auVar54._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
    auVar54._0_8_ = auVar23._0_8_;
    auVar54._12_4_ = (int)((ulong)auVar52._0_8_ >> 0x20);
    auVar30._0_8_ = CONCAT44(auVar47._8_4_,auVar27._8_4_);
    auVar30._8_4_ = auVar28._12_4_;
    auVar30._12_4_ = auVar48._12_4_;
    auVar20._0_8_ = CONCAT44(auVar37._8_4_,auVar18._8_4_);
    auVar20._8_4_ = auVar44._12_4_;
    auVar20._12_4_ = auVar38._12_4_;
    local_138[lVar10 * 0x10] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar26._0_4_);
    local_138[lVar10 * 0x10 + 1] = CONCAT44(CONCAT22(local_1c8,local_1d8._0_2_),auVar31._0_4_);
    local_138[lVar10 * 0x10 + 2] = auVar45._8_8_;
    auStack_110[lVar10 * 0x10 + -2] = auVar46._8_8_;
    auStack_110[lVar10 * 0x10 + -1] = auVar30._0_8_;
    *(int *)(auStack_110 + lVar10 * 0x10) = auVar32._8_4_;
    *(int *)((long)auStack_110 + (lVar10 * 0x20 + 1) * 4) = auVar55._8_4_;
    auStack_110[lVar10 * 0x10 + 1] = auVar30._8_8_;
    *(undefined4 *)((long)&uStack_f8 + lVar10 * 0x80) = auVar33._12_4_;
    *(undefined4 *)((long)auStack_f0 + lVar10 * 0x80 + -4) = auVar56._12_4_;
    *(ulong *)((long)&uStack_f8 + lVar10 * 0x80) = CONCAT44(uVar36,uVar17);
    auStack_f0[lVar10 * 0x10] = CONCAT44(uVar51,uVar22);
    auStack_f0[lVar10 * 0x10 + 1] = auVar50._8_8_;
    auStack_f0[lVar10 * 0x10 + 2] = auVar54._8_8_;
    auStack_d0[lVar10 * 0x10 + -1] = auVar20._0_8_;
    *(int *)(auStack_d0 + lVar10 * 0x10) = auVar23._8_4_;
    *(int *)((long)auStack_d0 + (lVar10 * 0x20 + 1) * 4) = auVar52._8_4_;
    auStack_d0[lVar10 * 0x10 + 1] = auVar20._8_8_;
    auStack_b8[lVar10 * 0x20] = auVar24._12_4_;
    auStack_b8[lVar10 * 0x20 + 1] = auVar53._12_4_;
    input = input + 8;
    bVar16 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar16);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar10 = 0x100;
    puVar13 = local_138;
    do {
      uVar3 = puVar13[1];
      *(undefined8 *)((long)local_248 + lVar10) = *puVar13;
      *(undefined8 *)((long)local_248 + lVar10 + 8) = uVar3;
      puVar13 = puVar13 + 2;
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != 0);
  }
  else {
    puVar15 = local_138;
  }
  (*local_248[0])(puVar15,puVar15,0xd);
  auVar19 = _DAT_0056f480;
  bVar2 = piVar8[2];
  if ((char)bVar2 < '\0') {
    auVar25 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar25 = pshuflw(auVar25,auVar25,0);
    auVar21._0_4_ = auVar25._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    lVar10 = 0;
    do {
      auVar25 = paddsw(*(undefined1 (*) [16])((long)puVar15 + lVar10),auVar21);
      auVar25 = psraw(auVar25,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar15 + lVar10) = auVar25;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar10 = 0;
    do {
      auVar25 = psllw(*(undefined1 (*) [16])((long)puVar15 + lVar10),ZEXT416((uint)(int)(char)bVar2)
                     );
      *(undefined1 (*) [16])((long)puVar15 + lVar10) = auVar25;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x100);
  }
  lVar10 = 0;
  do {
    auVar25 = *(undefined1 (*) [16])((long)puVar15 + lVar10);
    auVar43._0_12_ = auVar25._0_12_;
    auVar43._12_2_ = auVar25._6_2_;
    auVar43._14_2_ = 1;
    auVar42._12_4_ = auVar43._12_4_;
    auVar42._0_10_ = auVar25._0_10_;
    auVar42._10_2_ = 1;
    auVar41._10_6_ = auVar42._10_6_;
    auVar41._0_8_ = auVar25._0_8_;
    auVar41._8_2_ = auVar25._4_2_;
    auVar40._8_8_ = auVar41._8_8_;
    auVar40._0_8_ = 0x1000000000000;
    auVar39._6_10_ = auVar40._6_10_;
    auVar39._4_2_ = auVar25._2_2_;
    auVar39._0_2_ = auVar25._0_2_;
    auVar39._2_2_ = 1;
    auVar35._2_2_ = 0;
    auVar35._0_2_ = auVar25._8_2_;
    auVar35._4_2_ = auVar25._10_2_;
    auVar35._6_2_ = 0;
    auVar35._8_2_ = auVar25._12_2_;
    auVar35._10_2_ = 0;
    auVar35._12_2_ = auVar25._14_2_;
    auVar35._14_2_ = 1;
    auVar44 = pmaddwd(auVar39,auVar19);
    auVar25 = pmaddwd(auVar35,auVar19);
    piVar1 = (int *)((long)output + lVar10 * 2);
    *piVar1 = auVar44._0_4_ >> 0xc;
    piVar1[1] = auVar44._4_4_ >> 0xc;
    piVar1[2] = auVar44._8_4_ >> 0xc;
    piVar1[3] = auVar44._12_4_ >> 0xc;
    piVar1 = (int *)((long)output + lVar10 * 2 + 0x10);
    *piVar1 = auVar25._0_4_ >> 0xc;
    piVar1[1] = auVar25._4_4_ >> 0xc;
    piVar1[2] = auVar25._8_4_ >> 0xc;
    piVar1[3] = auVar25._12_4_ >> 0xc;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x100);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x8_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x8(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}